

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  __string_type __str;
  FilePath dir;
  long *local_80;
  long local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined1 *local_60;
  ulong local_58;
  undefined1 local_50 [16];
  FilePath local_40;
  
  if ((directory->pathname_)._M_string_length == 0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (relative_path->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (relative_path->pathname_)._M_string_length);
  }
  else {
    RemoveTrailingPathSeparator(&local_40,directory);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_40.pathname_._M_dataplus._M_p,
               local_40.pathname_._M_dataplus._M_p + local_40.pathname_._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_60,(ulong)(relative_path->pathname_)._M_dataplus._M_p
                               );
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_70 = *plVar4;
      uStack_68 = (undefined4)plVar3[3];
      uStack_64 = *(undefined4 *)((long)plVar3 + 0x1c);
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar3;
    }
    lVar2 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_80,lVar2 + (long)local_80);
    Normalize(__return_storage_ptr__);
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.pathname_._M_dataplus._M_p != &local_40.pathname_.field_2) {
      operator_delete(local_40.pathname_._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty()) return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}